

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::update_params(raft_server *this,raft_params *new_params)

{
  int32 iVar1;
  _Hash_node_base *p_Var2;
  __node_base *p_Var3;
  ptr<raft_params> clone;
  unique_lock<std::recursive_mutex> guard;
  undefined1 local_38 [16];
  unique_lock<std::recursive_mutex> local_28;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&local_28,&this->lock_);
  std::make_shared<nuraft::raft_params,nuraft::raft_params_const&>((raft_params *)local_38);
  nuraft::context::set_params
            ((this->ctx_)._M_t.
             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
             super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,
             (ptr<raft_params> *)local_38);
  apply_and_log_current_params(this);
  update_rand_timeout(this);
  if ((this->role_)._M_i != leader) {
    restart_election_timer(this);
  }
  p_Var3 = &(this->peers_)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    p_Var2 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(p_Var2 + 0x1b))->__data);
    iVar1 = *(int32 *)(local_38._0_8_ + 8);
    *(int32 *)((long)&p_Var2[0xb]._M_nxt + 4) = iVar1;
    LOCK();
    *(int32 *)&p_Var2[0xb]._M_nxt = iVar1;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)(p_Var2 + 0x1b));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void raft_server::update_params(const raft_params& new_params) {
    recur_lock(lock_);

    ptr<raft_params> clone = cs_new<raft_params>(new_params);
    ctx_->set_params(clone);
    apply_and_log_current_params();

    update_rand_timeout();
    if (role_ != srv_role::leader) {
        restart_election_timer();
    }
    for (auto& entry: peers_) {
        peer* p = entry.second.get();
        auto_lock(p->get_lock());
        p->set_hb_interval(clone->heart_beat_interval_);
        p->resume_hb_speed();
    }
}